

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.h
# Opt level: O1

int __thiscall
btPersistentManifold::getCacheEntry(btPersistentManifold *this,btManifoldPoint *newPoint)

{
  ulong uVar1;
  ulong uVar2;
  btScalar *pbVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0 < (long)this->m_cachedPoints) {
    fVar4 = this->m_contactBreakingThreshold * this->m_contactBreakingThreshold;
    pbVar3 = this->m_pointCache[0].m_localPointA.m_floats + 2;
    uVar1 = 0xffffffff;
    uVar2 = 0;
    do {
      fVar5 = ((btVector3 *)(pbVar3 + -2))->m_floats[0] - (newPoint->m_localPointA).m_floats[0];
      fVar6 = pbVar3[-1] - (newPoint->m_localPointA).m_floats[1];
      fVar7 = *pbVar3 - (newPoint->m_localPointA).m_floats[2];
      fVar5 = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
      if (fVar5 < fVar4) {
        uVar1 = uVar2 & 0xffffffff;
        fVar4 = fVar5;
      }
      uVar2 = uVar2 + 1;
      pbVar3 = pbVar3 + 0x30;
    } while ((long)this->m_cachedPoints != uVar2);
    return (int)uVar1;
  }
  return -1;
}

Assistant:

SIMD_FORCE_INLINE int	getNumContacts() const { return m_cachedPoints;}